

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O3

int32 gs_mgau_shortlist(gs_t *gs,int m,int n,float32 *feat,int bst_codeid)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int32 *piVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (n < 1) {
    piVar3 = gs->mgau_sl;
    *piVar3 = -1;
  }
  else {
    uVar1 = (*gs->codemap[m])[bst_codeid];
    iVar5 = 0;
    uVar4 = 0;
    do {
      if ((uVar1 >> (uVar4 & 0x1f) & 1) != 0) {
        lVar7 = (long)iVar5;
        iVar5 = iVar5 + 1;
        gs->mgau_sl[lVar7] = uVar4;
      }
      uVar4 = uVar4 + 1;
    } while (n != uVar4);
    piVar3 = gs->mgau_sl;
    piVar3[iVar5] = -1;
    auVar2 = _DAT_0014dce0;
    if (iVar5 != 0) {
      return iVar5;
    }
    if (0 < n) {
      lVar7 = (ulong)(uint)n - 1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_0014dce0;
      auVar9 = _DAT_0014dcd0;
      do {
        auVar10 = auVar9 ^ auVar2;
        if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                    auVar8._4_4_ < auVar10._4_4_) & 1)) {
          piVar3[uVar6] = (int)uVar6;
        }
        if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
            auVar10._12_4_ <= auVar8._12_4_) {
          piVar3[uVar6 + 1] = (int)uVar6 + 1;
        }
        uVar6 = uVar6 + 2;
        lVar7 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar7 + 2;
      } while ((n + 1U & 0xfffffffe) != uVar6);
      piVar3[(uint)n] = -1;
      return n;
    }
  }
  *piVar3 = -1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x127,"No active gaussian found in senone %d, with num. component = %d\n",m);
  return 0;
}

Assistant:

int32
gs_mgau_shortlist(gs_t * gs, int m, int n, float32 * feat, int bst_codeid)
{
    uint32 map;
    int32 bit_id;
    int32 nc;
    nc = 0;

    map = 0;
    map = gs->codemap[m][0][bst_codeid];

#if 0
    E_INFO("The map is %u, the length of gaussian %d\n", map, n);
#endif

    for (bit_id = 0; bit_id < n; bit_id++) {
        if (map & (1 << bit_id))
            gs->mgau_sl[nc++] = bit_id;
    }
    gs->mgau_sl[nc] = -1;

    if (nc == 0) {
        /* 20040222 ARCHAN : added to safe guard Gaussian Selection anomality */
        /* Special case when the number of components is smaller than the max. */
        /* This happens when zero vectors were removed from the codebook. */

        for (bit_id = 0; bit_id < n; bit_id++) {
            gs->mgau_sl[nc++] = bit_id;
        }
        gs->mgau_sl[nc] = -1;
    }

    if (nc == 0) {
        E_INFO
            ("No active gaussian found in senone %d, with num. component = %d\n",
             m, n);
    }
    return nc;

}